

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int call_binTM(lua_State *L,TValue *p1,TValue *p2,StkId res,TMS event)

{
  TValue *f;
  
  f = luaT_gettmbyobj(L,p1,event);
  if ((f->tt == 0) && (f = luaT_gettmbyobj(L,p2,event), f->tt == 0)) {
    return 0;
  }
  callTMres(L,res,f,p1,p2);
  return 1;
}

Assistant:

static int call_binTM(lua_State*L,const TValue*p1,const TValue*p2,
StkId res,TMS event){
const TValue*tm=luaT_gettmbyobj(L,p1,event);
if(ttisnil(tm))
tm=luaT_gettmbyobj(L,p2,event);
if(ttisnil(tm))return 0;
callTMres(L,res,tm,p1,p2);
return 1;
}